

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall LLVMBC::BasicBlock::add_successor(BasicBlock *this,BasicBlock *succ)

{
  __normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  _Var1;
  BasicBlock *local_10;
  
  local_10 = succ;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<LLVMBC::BasicBlock**,std::vector<LLVMBC::BasicBlock*,dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock*>>>,__gnu_cxx::__ops::_Iter_equals_val<LLVMBC::BasicBlock*const>>
                    ((this->succs).
                     super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->succs).
                     super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->succs).
      super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
    push_back(&this->succs,&local_10);
  }
  return;
}

Assistant:

void BasicBlock::add_successor(BasicBlock *succ)
{
	if (std::find(succs.begin(), succs.end(), succ) == succs.end())
		succs.push_back(succ);
}